

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  int err;
  size_t x;
  size_t remain;
  size_t n;
  size_t len_local;
  char *logline_local;
  AppendFile *this_local;
  
  remain = write(this,(int)logline,(void *)len,in_RCX);
  do {
    x = len - remain;
    if (x == 0) {
LAB_00138f9b:
      this->writtenBytes_ = len + this->writtenBytes_;
      return;
    }
    sVar2 = write(this,(int)logline + (int)remain,(void *)x,in_RCX);
    if ((sVar2 == 0) && (iVar1 = ferror((FILE *)this->fp_), iVar1 != 0)) {
      fprintf(_stderr,"AppendFile::append() failed!\n");
      goto LAB_00138f9b;
    }
    remain = sVar2 + remain;
  } while( true );
}

Assistant:

void AppendFile::append(const char* logline, const size_t len) {
    size_t n = write(logline, len);
    size_t remain = len - n;
    while (remain > 0) {
        size_t x = write(logline + n, remain);
        if (x == 0) {
           int err = ferror(fp_);
           if (err) {
               fprintf(stderr, "AppendFile::append() failed!\n");
               break;
           }
        }
        n += x;
        remain = len - n;
    }
    writtenBytes_ += len;
}